

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O2

void __thiscall HModel::initBasicIndex(HModel *this)

{
  pointer piVar1;
  pointer piVar2;
  int var;
  long lVar3;
  int iVar4;
  
  piVar1 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar2 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar4 = 0;
  for (lVar3 = 0; lVar3 < this->numTot; lVar3 = lVar3 + 1) {
    if (piVar2[lVar3] == 0) {
      piVar1[iVar4] = (int)lVar3;
      iVar4 = iVar4 + 1;
    }
  }
  return;
}

Assistant:

void HModel::initBasicIndex() {
  int numBasic = 0;
  for (int var = 0; var < numTot; var++) {
    if (!nonbasicFlag[var]) {
      assert(numBasic<numRow);
      basicIndex[numBasic] = var;
      numBasic++;
    }
  }
  assert(numBasic=numRow-1);
}